

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::ImageCreateInfo::ImageCreateInfo
          (ImageCreateInfo *this,VkImageType _imageType,VkFormat _format,VkExtent3D _extent,
          deUint32 _mipLevels,deUint32 _arrayLayers,VkSampleCountFlagBits _samples,
          VkImageTiling _tiling,VkImageUsageFlags _usage,VkSharingMode _sharingMode,
          deUint32 _queueFamilyIndexCount,deUint32 *_pQueueFamilyIndices,VkImageCreateFlags _flags,
          VkImageLayout _initialLayout)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  allocator_type local_51;
  deUint32 local_50;
  deUint32 local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_50 = _extent.depth;
  (this->m_queueFamilyIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_queueFamilyIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_queueFamilyIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c = _mipLevels;
  if (_queueFamilyIndexCount == 0) {
    puVar1 = (pointer)0x0;
    puVar2 = (pointer)0x0;
  }
  else {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,_pQueueFamilyIndices,
               _pQueueFamilyIndices + _queueFamilyIndexCount,&local_51);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
              (&this->m_queueFamilyIndices,&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    puVar1 = (this->m_queueFamilyIndices).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->m_queueFamilyIndices).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (this->super_VkImageCreateInfo).sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  (this->super_VkImageCreateInfo).pNext = (void *)0x0;
  (this->super_VkImageCreateInfo).flags = _flags;
  (this->super_VkImageCreateInfo).imageType = _imageType;
  (this->super_VkImageCreateInfo).format = _format;
  (this->super_VkImageCreateInfo).extent.width = (int)_extent._0_8_;
  (this->super_VkImageCreateInfo).extent.height = (int)((ulong)_extent._0_8_ >> 0x20);
  (this->super_VkImageCreateInfo).extent.depth = local_50;
  (this->super_VkImageCreateInfo).mipLevels = local_4c;
  (this->super_VkImageCreateInfo).arrayLayers = _arrayLayers;
  (this->super_VkImageCreateInfo).samples = _samples;
  (this->super_VkImageCreateInfo).tiling = _tiling;
  (this->super_VkImageCreateInfo).usage = _usage;
  (this->super_VkImageCreateInfo).sharingMode = _sharingMode;
  puVar3 = (pointer)0x0;
  if (puVar2 != puVar1) {
    puVar3 = puVar1;
  }
  (this->super_VkImageCreateInfo).queueFamilyIndexCount = _queueFamilyIndexCount;
  (this->super_VkImageCreateInfo).pQueueFamilyIndices = puVar3;
  (this->super_VkImageCreateInfo).initialLayout = _initialLayout;
  return;
}

Assistant:

ImageCreateInfo::ImageCreateInfo (vk::VkImageType			_imageType,
								  vk::VkFormat				_format,
								  vk::VkExtent3D			_extent,
								  deUint32					_mipLevels,
								  deUint32					_arrayLayers,
								  vk::VkSampleCountFlagBits	_samples,
								  vk::VkImageTiling			_tiling,
								  vk::VkImageUsageFlags		_usage,
								  vk::VkSharingMode			_sharingMode,
								  deUint32					_queueFamilyIndexCount,
								  const deUint32*			_pQueueFamilyIndices,
								  vk::VkImageCreateFlags	_flags,
								  vk::VkImageLayout			_initialLayout)
{
	if (_queueFamilyIndexCount)
	{
		m_queueFamilyIndices = std::vector<deUint32>(_pQueueFamilyIndices, _pQueueFamilyIndices + _queueFamilyIndexCount);
	}

	sType = vk::VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
	pNext = DE_NULL;
	flags					= _flags;
	imageType				= _imageType;
	format					= _format;
	extent					= _extent;
	mipLevels				= _mipLevels;
	arrayLayers				= _arrayLayers;
	samples					= _samples;
	tiling					= _tiling;
	usage					= _usage;
	sharingMode				= _sharingMode;
	queueFamilyIndexCount	= _queueFamilyIndexCount;

	if (m_queueFamilyIndices.size())
	{
		pQueueFamilyIndices = &m_queueFamilyIndices[0];
	}
	else
	{
		pQueueFamilyIndices = DE_NULL;
	}
	initialLayout	= _initialLayout;
}